

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O1

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QDockAreaLayoutItem>>
          (QtPrivate *this,QDebug debug,char *which,QList<QDockAreaLayoutItem> *c)

{
  Representation *pRVar1;
  QDockAreaLayoutItem *pQVar2;
  char *pcVar3;
  QTextStream *pQVar4;
  long lVar5;
  undefined8 uVar6;
  storage_type *psVar7;
  storage_type *psVar8;
  QDockAreaLayoutItem *pQVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QDebugStateSaver saver;
  undefined1 local_78 [24];
  undefined1 local_60 [8];
  undefined1 *local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)debug.stream);
  pQVar4 = *(QTextStream **)debug.stream;
  pQVar4[0x30] = (QTextStream)0x0;
  if (which == (char *)0x0) {
    psVar8 = (storage_type *)0x0;
  }
  else {
    psVar7 = (storage_type *)0xffffffffffffffff;
    do {
      psVar8 = psVar7 + 1;
      pcVar3 = which + 1 + (long)psVar7;
      psVar7 = psVar8;
    } while (*pcVar3 != '\0');
  }
  QVar10.m_data = psVar8;
  QVar10.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar10);
  QTextStream::operator<<(pQVar4,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,'(');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  pQVar9 = (c->d).ptr;
  lVar5 = (c->d).size;
  pQVar2 = pQVar9 + lVar5;
  if (lVar5 != 0) {
    local_78._16_8_ = *(undefined8 *)debug.stream;
    pRVar1 = &(((QPlaceHolderItem *)local_78._16_8_)->topLevelRect).y2;
    pRVar1->m_i = pRVar1->m_i + 1;
    ::operator<<((Stream *)local_60,(QDockAreaLayoutItem *)(local_78 + 0x10));
    QDebug::~QDebug((QDebug *)local_60);
    QDebug::~QDebug((QDebug *)(local_78 + 0x10));
    pQVar9 = pQVar9 + 1;
  }
  if (pQVar9 != pQVar2) {
    do {
      pQVar4 = *(QTextStream **)debug.stream;
      QVar11.m_data = (storage_type *)0x2;
      QVar11.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar11);
      QTextStream::operator<<(pQVar4,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
      }
      local_78._0_8_ = *(undefined8 *)debug.stream;
      (((QLayoutItem *)(local_78._0_8_ + 0x20))->align).
      super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (((QLayoutItem *)(local_78._0_8_ + 0x20))->align).
           super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i
           + 1;
      ::operator<<((Stream *)(local_78 + 8),(QDockAreaLayoutItem *)local_78);
      QDebug::~QDebug((QDebug *)(local_78 + 8));
      QDebug::~QDebug((QDebug *)local_78);
      pQVar9 = pQVar9 + 1;
    } while (pQVar9 != pQVar2);
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,')');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  uVar6 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar6;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}